

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_intval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_int64 iValue;
  
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    iValue = jx9_value_to_int64(*apArg);
    jx9_result_int64(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Builtin_intval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return 0 */
		jx9_result_int(pCtx, 0);
	}else{
		sxi64 iVal;
		/* Perform the cast */
		iVal = jx9_value_to_int64(apArg[0]);
		jx9_result_int64(pCtx, iVal);
	}
	return JX9_OK;
}